

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::setActiveWindow(QGraphicsScene *this,QGraphicsWidget *widget)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QGraphicsScene *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  double dVar8;
  double local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QGraphicsWidget *)0x0) {
    pQVar5 = (QGraphicsItem *)0x0;
  }
  else {
    pQVar5 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
    pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
    if (pQVar4 != this) {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,
                 "QGraphicsScene::setActiveWindow: widget %p must be part of this scene",widget);
      goto LAB_0059620c;
    }
    pQVar5 = QGraphicsItem::panel(pQVar5);
  }
  setActivePanel(this,pQVar5);
  if (pQVar5 != (QGraphicsItem *)0x0) {
    pQVar6 = QGraphicsItem::parentItem(pQVar5);
    local_60 = QGraphicsItem::zValue(pQVar5);
    local_58.size._0_4_ = 0xaaaaaaaa;
    local_58.size._4_4_ = 0xaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    if (pQVar6 == (QGraphicsItem *)0x0) {
      (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
                (&local_58,*(long **)(*(long *)(this + 8) + 0x88),1);
    }
    else {
      QGraphicsItem::childItems((QList<QGraphicsItem_*> *)&local_58,pQVar6);
    }
    lVar1 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    lVar2 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    for (lVar7 = 0; lVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
      pQVar6 = *(QGraphicsItem **)(lVar1 + lVar7);
      dVar8 = local_60;
      if (((pQVar6 != pQVar5) && (bVar3 = QGraphicsItem::isWindow(pQVar6), bVar3)) &&
         (dVar8 = QGraphicsItem::zValue(pQVar6), dVar8 <= local_60)) {
        dVar8 = local_60;
      }
      local_60 = dVar8;
    }
    QGraphicsItem::setZValue(pQVar5,local_60 + 0.001);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  }
LAB_0059620c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setActiveWindow(QGraphicsWidget *widget)
{
    if (widget && widget->scene() != this) {
        qWarning("QGraphicsScene::setActiveWindow: widget %p must be part of this scene",
                 widget);
        return;
    }

    // Activate the widget's panel (all windows are panels).
    QGraphicsItem *panel = widget ? widget->panel() : nullptr;
    setActivePanel(panel);

    // Raise
    if (panel) {
        QGraphicsItem *parent = panel->parentItem();
        // Raise ### inefficient for toplevels

        // Find the highest z value.
        qreal z = panel->zValue();
        const auto siblings = parent ? parent->childItems() : items();
        for (QGraphicsItem *sibling : siblings) {
            if (sibling != panel && sibling->isWindow())
                z = qMax(z, sibling->zValue());
        }

        // This will probably never overflow.
        const qreal litt = qreal(0.001);
        panel->setZValue(z + litt);
    }
}